

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O2

void __thiscall
Diligent::ShaderVariableManagerGL::ImageBindInfo::BindResource
          (ImageBindInfo *this,BindResourceInfo *BindInfo)

{
  SHADER_RESOURCE_TYPE ResourceType;
  ShaderResourceCacheGL *this_00;
  PipelineResourceDesc *ResDesc;
  ResourceAttribs *pRVar1;
  CachedResourceView *pCVar2;
  char (*in_R8) [41];
  initializer_list<Diligent::BUFFER_VIEW_TYPE> ExpectedViewTypes;
  RefCntAutoPtr<Diligent::BufferViewGLImpl> pViewGL_1;
  string msg;
  
  ResDesc = ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
            ::GetDesc((ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                       *)this);
  pRVar1 = GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>::GetAttribs
                     (&this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>)
  ;
  if (ResDesc->ArraySize <= BindInfo->ArrayIndex) {
    FormatString<char[89]>
              (&msg,(char (*) [89])
                    "Index is out of range, but it should\'ve been corrected by ShaderVariableBase::SetArray()"
              );
    DebugAssertionFailed
              ((Char *)CONCAT71(msg._M_dataplus._M_p._1_7_,msg._M_dataplus._M_p._0_1_),
               "BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x128);
    std::__cxx11::string::~string((string *)&msg);
  }
  this_00 = (((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>).
              super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
             .m_ParentManager)->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>)
            .m_ResourceCache;
  ResourceType = ResDesc->ResourceType;
  if (ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV) {
    RefCntAutoPtr<Diligent::BufferViewGLImpl>::RefCntAutoPtr
              (&pViewGL_1,&BindInfo->pObject->super_IObject,(INTERFACE_ID *)IID_BufferViewGL);
    pCVar2 = ShaderResourceCacheGL::GetConstImage
                       (this_00,BindInfo->ArrayIndex + pRVar1->CacheOffset);
    msg._M_dataplus._M_p._0_1_ = 2;
    ExpectedViewTypes._M_len = 1;
    ExpectedViewTypes._M_array = (iterator)0x1;
    VerifyResourceViewBinding<Diligent::BufferViewGLImpl,Diligent::BUFFER_VIEW_TYPE>
              ((Diligent *)ResDesc,(PipelineResourceDesc *)BindInfo,
               (BindResourceInfo *)pViewGL_1.m_pObject,(BufferViewGLImpl *)&msg,ExpectedViewTypes,
               RESOURCE_DIM_UNDEFINED,SUB81((pCVar2->pView).m_pObject,0),
               (IDeviceObject *)
               (((((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>).
                   super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                  .m_ParentManager)->
                 super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).m_pSignature)
               ->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,(char *)pViewGL_1.m_pObject);
    if ((ResDesc->Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) == PIPELINE_RESOURCE_FLAG_NONE) {
      FormatString<char[93]>
                (&msg,(char (*) [93])
                      "FORMATTED_BUFFER resource flag is not set for an image buffer - this should\'ve not happened."
                );
      DebugAssertionFailed
                ((Char *)CONCAT71(msg._M_dataplus._M_p._1_7_,msg._M_dataplus._M_p._0_1_),
                 "BindResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0x14b);
      std::__cxx11::string::~string((string *)&msg);
    }
    ValidateBufferMode<Diligent::BufferViewGLImpl>(ResDesc,BindInfo->ArrayIndex,pViewGL_1.m_pObject)
    ;
    ShaderResourceCacheGL::SetBufImage
              (this_00,BindInfo->ArrayIndex + pRVar1->CacheOffset,&pViewGL_1);
    RefCntAutoPtr<Diligent::BufferViewGLImpl>::Release(&pViewGL_1);
  }
  else if (ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV) {
    RefCntAutoPtr<Diligent::TextureViewGLImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::TextureViewGLImpl> *)&msg,&BindInfo->pObject->super_IObject,
               (INTERFACE_ID *)IID_TextureViewGL);
    pCVar2 = ShaderResourceCacheGL::GetConstImage
                       (this_00,BindInfo->ArrayIndex + pRVar1->CacheOffset);
    pViewGL_1.m_pObject._0_1_ = 5;
    VerifyResourceViewBinding<Diligent::TextureViewGLImpl,Diligent::TEXTURE_VIEW_TYPE>
              ((Diligent *)ResDesc,(PipelineResourceDesc *)BindInfo,
               (BindResourceInfo *)CONCAT71(msg._M_dataplus._M_p._1_7_,msg._M_dataplus._M_p._0_1_),
               (TextureViewGLImpl *)&pViewGL_1,
               (initializer_list<Diligent::TEXTURE_VIEW_TYPE>)ZEXT816(1),RESOURCE_DIM_UNDEFINED,
               SUB81((pCVar2->pView).m_pObject,0),
               (IDeviceObject *)
               (((((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>).
                   super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                  .m_ParentManager)->
                 super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).m_pSignature)
               ->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,(char *)pViewGL_1.m_pObject);
    ShaderResourceCacheGL::SetTexImage
              (this_00,BindInfo->ArrayIndex + pRVar1->CacheOffset,
               (RefCntAutoPtr<Diligent::TextureViewGLImpl> *)&msg);
    RefCntAutoPtr<Diligent::TextureViewGLImpl>::Release
              ((RefCntAutoPtr<Diligent::TextureViewGLImpl> *)&msg);
  }
  else {
    pViewGL_1.m_pObject = (BufferViewGLImpl *)GetShaderResourceTypeLiteralName(ResourceType,false);
    FormatString<char[26],char_const*,char[41]>
              (&msg,(Diligent *)"Unexpected resource type ",(char (*) [26])&pViewGL_1,
               (char **)". Texture UAV or buffer UAV is expected.",in_R8);
    DebugAssertionFailed
              ((Char *)CONCAT71(msg._M_dataplus._M_p._1_7_,msg._M_dataplus._M_p._0_1_),
               "BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x153);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void ShaderVariableManagerGL::ImageBindInfo::BindResource(const BindResourceInfo& BindInfo)
{
    const auto& Desc = GetDesc();
    const auto& Attr = GetAttribs();

    VERIFY(BindInfo.ArrayIndex < Desc.ArraySize, "Index is out of range, but it should've been corrected by ShaderVariableBase::SetArray()");
    auto& ResourceCache = m_ParentManager.m_ResourceCache;

    if (Desc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV)
    {
        // We cannot use ClassPtrCast<> here as the resource can be of wrong type
        RefCntAutoPtr<TextureViewGLImpl> pViewGL{BindInfo.pObject, IID_TextureViewGL};
#ifdef DILIGENT_DEVELOPMENT
        {
            const auto& CachedUAV = ResourceCache.GetConstImage(Attr.CacheOffset + BindInfo.ArrayIndex);
            VerifyResourceViewBinding(Desc, BindInfo, pViewGL.RawPtr(),
                                      {TEXTURE_VIEW_UNORDERED_ACCESS}, // Expected view type
                                      RESOURCE_DIM_UNDEFINED,          // Expected resource dimension - unknown at this point
                                      false,                           // IsMultisample (ignored when resource dim is unknown)
                                      CachedUAV.pView.RawPtr(),
                                      m_ParentManager.m_pSignature->GetDesc().Name);
        }
#endif
        ResourceCache.SetTexImage(Attr.CacheOffset + BindInfo.ArrayIndex, std::move(pViewGL));
    }
    else if (Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV)
    {
        // We cannot use ClassPtrCast<> here as the resource can be of wrong type
        RefCntAutoPtr<BufferViewGLImpl> pViewGL{BindInfo.pObject, IID_BufferViewGL};
#ifdef DILIGENT_DEVELOPMENT
        {
            const auto& CachedUAV = ResourceCache.GetConstImage(Attr.CacheOffset + BindInfo.ArrayIndex);
            VerifyResourceViewBinding(Desc, BindInfo, pViewGL.RawPtr(),
                                      {BUFFER_VIEW_UNORDERED_ACCESS}, // Expected view type
                                      RESOURCE_DIM_BUFFER,            // Expected resource dimension
                                      false,                          // IsMultisample (ignored when resource dim is buffer)
                                      CachedUAV.pView.RawPtr(),
                                      m_ParentManager.m_pSignature->GetDesc().Name);

            VERIFY((Desc.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != 0,
                   "FORMATTED_BUFFER resource flag is not set for an image buffer - this should've not happened.");
            ValidateBufferMode(Desc, BindInfo.ArrayIndex, pViewGL.RawPtr());
        }
#endif
        ResourceCache.SetBufImage(Attr.CacheOffset + BindInfo.ArrayIndex, std::move(pViewGL));
    }
    else
    {
        UNEXPECTED("Unexpected resource type ", GetShaderResourceTypeLiteralName(Desc.ResourceType), ". Texture UAV or buffer UAV is expected.");
    }
}